

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O3

int xmlFAEqualAtoms(xmlRegAtomPtr atom1,xmlRegAtomPtr atom2,int deep)

{
  xmlRegAtomType xVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  
  if (atom1 == atom2) {
    return 1;
  }
  uVar3 = 0;
  if ((atom2 != (xmlRegAtomPtr)0x0 && atom1 != (xmlRegAtomPtr)0x0) &&
     (xVar1 = atom1->type, xVar1 == atom2->type)) {
    if (xVar1 == XML_REGEXP_CHARVAL) {
      bVar4 = atom1->codepoint == atom2->codepoint;
    }
    else {
      if (xVar1 != XML_REGEXP_STRING) {
        return 0;
      }
      if (deep != 0) {
        iVar2 = xmlStrEqual((xmlChar *)atom1->valuep,(xmlChar *)atom2->valuep);
        return iVar2;
      }
      bVar4 = atom1->valuep == atom2->valuep;
    }
    uVar3 = (uint)bVar4;
  }
  return uVar3;
}

Assistant:

static int
xmlFAEqualAtoms(xmlRegAtomPtr atom1, xmlRegAtomPtr atom2, int deep) {
    int ret = 0;

    if (atom1 == atom2)
	return(1);
    if ((atom1 == NULL) || (atom2 == NULL))
	return(0);

    if (atom1->type != atom2->type)
        return(0);
    switch (atom1->type) {
        case XML_REGEXP_EPSILON:
	    ret = 0;
	    break;
        case XML_REGEXP_STRING:
            if (!deep)
                ret = (atom1->valuep == atom2->valuep);
            else
                ret = xmlStrEqual((xmlChar *)atom1->valuep,
                                  (xmlChar *)atom2->valuep);
	    break;
        case XML_REGEXP_CHARVAL:
	    ret = (atom1->codepoint == atom2->codepoint);
	    break;
	case XML_REGEXP_RANGES:
	    /* too hard to do in the general case */
	    ret = 0;
	default:
	    break;
    }
    return(ret);
}